

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# World_3df.cpp
# Opt level: O2

double __thiscall World_3df::Evaluate_fitness(World_3df *this,size_t genno)

{
  type pPVar1;
  type pFVar2;
  creat_t *pcVar3;
  ostream *poVar4;
  double extraout_XMM0_Qa;
  Msg local_2d8;
  Msg local_2a8;
  Msg local_278;
  Msg local_248;
  Msg local_218;
  string local_1e8;
  Msg local_1c8;
  Msg local_198;
  Msg local_168;
  Msg local_138;
  string local_108;
  string local_e8;
  string local_c8;
  string local_a8;
  string local_88;
  double local_68;
  World_3df *local_60;
  size_t local_58;
  shared_ptr<Population> *local_50;
  double local_48;
  long local_40;
  allocator local_34;
  allocator local_33;
  allocator local_32;
  allocator local_31;
  
  local_50 = (this->super_World).pops.
             super__Vector_base<boost::shared_ptr<Population>,_std::allocator<boost::shared_ptr<Population>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
  local_68 = 0.0;
  local_40 = 0;
  local_60 = this;
  local_58 = genno;
  for (; local_50 !=
         (this->super_World).pops.
         super__Vector_base<boost::shared_ptr<Population>,_std::allocator<boost::shared_ptr<Population>_>_>
         ._M_impl.super__Vector_impl_data._M_finish; local_50 = local_50 + 1) {
    pPVar1 = boost::shared_ptr<Population>::operator->(local_50);
    (*pPVar1->_vptr_Population[6])(pPVar1);
    local_88._M_dataplus._M_p = (pointer)(this->super_World).LOGFILE.px;
    local_88._M_string_length = (size_type)(this->super_World).LOGFILE.pn.pi_;
    if ((sp_counted_base *)local_88._M_string_length != (sp_counted_base *)0x0) {
      LOCK();
      ((sp_counted_base *)local_88._M_string_length)->use_count_ =
           ((sp_counted_base *)local_88._M_string_length)->use_count_ + 1;
      UNLOCK();
    }
    local_48 = extraout_XMM0_Qa;
    pFVar2 = boost::shared_ptr<util::logging::File_logger>::operator*
                       ((shared_ptr<util::logging::File_logger> *)&local_88);
    local_1e8._M_dataplus._M_p = (pointer)&local_1e8.field_2;
    std::__cxx11::string::_M_construct((ulong)&local_1e8,'\x0f');
    util::logging::Msg::Msg(&local_218,&local_1e8,L_NORM);
    std::__cxx11::string::string((string *)&local_a8,"[",&local_34);
    util::logging::Msg::operator+(&local_248,&local_218,&local_a8);
    util::logging::Msg::operator+(&local_138,&local_248,local_58);
    std::__cxx11::string::string((string *)&local_108,"]: Fitnes populacji nr ",&local_33);
    util::logging::Msg::operator+(&local_278,&local_138,&local_108);
    util::logging::Msg::operator+(&local_168,&local_278,local_40);
    std::__cxx11::string::string((string *)&local_e8," (",&local_32);
    util::logging::Msg::operator+(&local_198,&local_168,&local_e8);
    pPVar1 = boost::shared_ptr<Population>::operator->(local_50);
    pcVar3 = Population::get_creatures(pPVar1);
    util::logging::Msg::operator+
              (&local_1c8,&local_198,
               (long)(pcVar3->
                     super__Vector_base<boost::shared_ptr<Creature>,_std::allocator<boost::shared_ptr<Creature>_>_>
                     )._M_impl.super__Vector_impl_data._M_finish -
               (long)(pcVar3->
                     super__Vector_base<boost::shared_ptr<Creature>,_std::allocator<boost::shared_ptr<Creature>_>_>
                     )._M_impl.super__Vector_impl_data._M_start >> 4);
    std::__cxx11::string::string((string *)&local_c8,")  = ",&local_31);
    util::logging::Msg::operator+(&local_2a8,&local_1c8,&local_c8);
    util::logging::Msg::operator+(&local_2d8,&local_2a8,local_48);
    (*(pFVar2->super_Ostream_logger).super_Logger._vptr_Logger[3])(pFVar2,&local_2d8);
    util::logging::Msg::~Msg(&local_2d8);
    util::logging::Msg::~Msg(&local_2a8);
    std::__cxx11::string::~string((string *)&local_c8);
    util::logging::Msg::~Msg(&local_1c8);
    util::logging::Msg::~Msg(&local_198);
    std::__cxx11::string::~string((string *)&local_e8);
    util::logging::Msg::~Msg(&local_168);
    util::logging::Msg::~Msg(&local_278);
    std::__cxx11::string::~string((string *)&local_108);
    util::logging::Msg::~Msg(&local_138);
    util::logging::Msg::~Msg(&local_248);
    std::__cxx11::string::~string((string *)&local_a8);
    util::logging::Msg::~Msg(&local_218);
    std::__cxx11::string::~string((string *)&local_1e8);
    boost::detail::shared_count::~shared_count((shared_count *)&local_88._M_string_length);
    local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
    std::__cxx11::string::_M_construct((ulong)&local_a8,'\x0f');
    this = local_60;
    util::logging::Msg::Msg(&local_218,&local_a8,L_NORM);
    std::__cxx11::string::string((string *)&local_108,"[",&local_34);
    util::logging::Msg::operator+(&local_248,&local_218,&local_108);
    util::logging::Msg::operator+(&local_138,&local_248,local_58);
    std::__cxx11::string::string((string *)&local_e8,"]: Fitnes populacji nr ",&local_33);
    util::logging::Msg::operator+(&local_278,&local_138,&local_e8);
    util::logging::Msg::operator+(&local_168,&local_278,local_40);
    std::__cxx11::string::string((string *)&local_c8," (",&local_32);
    util::logging::Msg::operator+(&local_198,&local_168,&local_c8);
    pPVar1 = boost::shared_ptr<Population>::operator->(local_50);
    pcVar3 = Population::get_creatures(pPVar1);
    util::logging::Msg::operator+
              (&local_1c8,&local_198,
               (long)(pcVar3->
                     super__Vector_base<boost::shared_ptr<Creature>,_std::allocator<boost::shared_ptr<Creature>_>_>
                     )._M_impl.super__Vector_impl_data._M_finish -
               (long)(pcVar3->
                     super__Vector_base<boost::shared_ptr<Creature>,_std::allocator<boost::shared_ptr<Creature>_>_>
                     )._M_impl.super__Vector_impl_data._M_start >> 4);
    std::__cxx11::string::string((string *)&local_88,")  = ",&local_31);
    util::logging::Msg::operator+(&local_2a8,&local_1c8,&local_88);
    util::logging::Msg::operator+(&local_2d8,&local_2a8,local_48);
    util::logging::Msg::getMsg_txt_abi_cxx11_(&local_1e8,&local_2d8);
    poVar4 = std::operator<<((ostream *)&std::cout,(string *)&local_1e8);
    std::endl<char,std::char_traits<char>>(poVar4);
    std::__cxx11::string::~string((string *)&local_1e8);
    util::logging::Msg::~Msg(&local_2d8);
    util::logging::Msg::~Msg(&local_2a8);
    std::__cxx11::string::~string((string *)&local_88);
    util::logging::Msg::~Msg(&local_1c8);
    util::logging::Msg::~Msg(&local_198);
    std::__cxx11::string::~string((string *)&local_c8);
    util::logging::Msg::~Msg(&local_168);
    util::logging::Msg::~Msg(&local_278);
    std::__cxx11::string::~string((string *)&local_e8);
    util::logging::Msg::~Msg(&local_138);
    util::logging::Msg::~Msg(&local_248);
    std::__cxx11::string::~string((string *)&local_108);
    util::logging::Msg::~Msg(&local_218);
    std::__cxx11::string::~string((string *)&local_a8);
    local_40 = local_40 + 1;
    local_68 = local_68 + local_48;
  }
  return local_68;
}

Assistant:

double World_3df::Evaluate_fitness( size_t genno )
{
	double ret = 0, tmp = 0;
	size_t ctr = 0;
	for(pop_t::iterator it = pops.begin(); it != pops.end(); ++it)
	{
		tmp = (*it)->Evaluate_fitness();

		(*get_log()) << util::logging::Msg(std::string(15, '-')) + "[" + static_cast<long long> (genno)
				+ "]: Fitnes populacji nr " + static_cast<long long> (ctr) + " ("
				+ static_cast<long long> ((*it)->get_creatures().size()) + ")  = " + tmp;

		std::cout << (util::logging::Msg(std::string(15, '-')) + "[" + static_cast<long long> (genno)
				+ "]: Fitnes populacji nr " + static_cast<long long> (ctr) + " ("
				+ static_cast<long long> ((*it)->get_creatures().size()) + ")  = " + tmp).getMsg_txt() << std::endl;

		ctr++;
		ret += tmp;

	}

	return ret;

}